

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_ssb_sw.c
# Opt level: O0

void ssb_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double *ext_params_00;
  xc_func_type *p_00;
  double tmp_kt [2];
  double tmp_ssb [5];
  double delta;
  double u;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  
  ext_params_00 = (double *)get_ext_param(in_RDI,in_RSI,0);
  p_00 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,1);
  get_ext_param(in_RDI,in_RSI,2);
  get_ext_param(in_RDI,in_RSI,3);
  get_ext_param(in_RDI,in_RSI,4);
  get_ext_param(in_RDI,in_RSI,5);
  get_ext_param(in_RDI,in_RSI,6);
  get_ext_param(in_RDI,in_RSI,7);
  xc_func_set_ext_params(p_00,ext_params_00);
  xc_func_set_ext_params(p_00,ext_params_00);
  return;
}

Assistant:

static void
ssb_set_ext_params(xc_func_type *p, const double *ext_params) {
  double A, B, C, D, E, F, u, delta;
  double tmp_ssb[5];
  double tmp_kt[2];

  /* Get the parameters */
  A = get_ext_param(p, ext_params, 0);
  B = get_ext_param(p, ext_params, 1);
  C = get_ext_param(p, ext_params, 2);
  D = get_ext_param(p, ext_params, 3);
  E = get_ext_param(p, ext_params, 4);
  F = get_ext_param(p, ext_params, 5);
  u = get_ext_param(p, ext_params, 6);
  delta = get_ext_param(p, ext_params, 7);

  /* Calculate the parameters for SSB-SW and KT1 */
  tmp_ssb[0] = A;
  tmp_ssb[1] = B;
  tmp_ssb[2] = C;
  tmp_ssb[3] = D * (1.0-u);
  tmp_ssb[4] = E;
  /* Swart et al define KT in terms of s^2 not x^2  */
  tmp_kt[0] = u * F * B * (X2S*X2S) * X_FACTOR_C;
  tmp_kt[1] = delta;

  /* Set the SSB and KT parameters */
  xc_func_set_ext_params(p->func_aux[1], tmp_ssb);
  xc_func_set_ext_params(p->func_aux[2], tmp_kt);
}